

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O2

void __thiscall
trieste::Reader::Reader
          (Reader *this,string *language_name,
          vector<std::shared_ptr<trieste::PassDef>,_std::allocator<std::shared_ptr<trieste::PassDef>_>_>
          *passes,Parse *parser)

{
  allocator<char> local_32;
  allocator<char> local_31;
  
  std::__cxx11::string::string
            ((string *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)language_name);
  CLI::std::
  vector<std::shared_ptr<trieste::PassDef>,_std::allocator<std::shared_ptr<trieste::PassDef>_>_>::
  vector(&this->passes_,
         (vector<std::shared_ptr<trieste::PassDef>,_std::allocator<std::shared_ptr<trieste::PassDef>_>_>
          *)passes);
  Parse::Parse(&this->parser_,parser);
  (this->input_).
  super__Optional_base<std::variant<std::filesystem::__cxx11::path,_std::shared_ptr<trieste::SourceDef>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::variant<std::filesystem::__cxx11::path,_std::shared_ptr<trieste::SourceDef>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::variant<std::filesystem::__cxx11::path,_std::shared_ptr<trieste::SourceDef>_>_>
  ._M_engaged = false;
  this->debug_enabled_ = false;
  this->wf_check_enabled_ = false;
  std::filesystem::__cxx11::path::path<char[2],std::filesystem::__cxx11::path>
            ((path *)&this->debug_path_,(char (*) [2])0x1f2593,auto_format);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->start_pass_,"",&local_31);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->end_pass_,"",&local_32);
  this->offset_ = 0;
  return;
}

Assistant:

Reader(
      const std::string& language_name,
      const std::vector<Pass>& passes,
      const Parse& parser)
    : language_name_(language_name),
      passes_(passes),
      parser_(parser),
      debug_enabled_(false),
      wf_check_enabled_(false),
      debug_path_("."),
      start_pass_(""),
      end_pass_(""),
      offset_(0)
    {}